

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::setRange
          (MutableCodePointTrie *this,UChar32 start,UChar32 end,uint32_t value,UErrorCode *errorCode
          )

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t *puVar11;
  ulong uVar12;
  uint32_t *puVar13;
  uint uVar14;
  ulong uVar15;
  UErrorCode UVar16;
  uint uVar17;
  int iVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar15 = (ulong)(uint)start;
  UVar16 = U_ILLEGAL_ARGUMENT_ERROR;
  if (((start <= end) && ((uint)start < 0x110000)) && ((uint)end < 0x110000)) {
    bVar5 = ensureHighStart(this,end);
    UVar16 = U_MEMORY_ALLOCATION_ERROR;
    if (bVar5) {
      uVar9 = end + 1;
      uVar17 = start & 0xf;
      if (uVar17 != 0) {
        uVar6 = getDataBlock(this,(uint)start >> 4);
        auVar4 = _DAT_001f6c00;
        auVar3 = _DAT_001f6350;
        auVar2 = _DAT_001f6340;
        if ((int)uVar6 < 0) {
          UVar16 = U_MEMORY_ALLOCATION_ERROR;
          goto LAB_001c0152;
        }
        uVar14 = start + 0xfU & 0x3ffff0;
        uVar15 = (ulong)uVar14;
        puVar1 = this->data;
        uVar8 = (ulong)uVar6;
        if (uVar9 < uVar14) {
          if ((uVar9 & 0xf) <= uVar17) {
            return;
          }
          uVar15 = (ulong)(uVar17 << 2);
          puVar11 = (uint32_t *)((long)puVar1 + uVar15 + uVar8 * 4 + 4);
          puVar13 = puVar1 + uVar8 + (uVar9 & 0xf);
          if (puVar1 + uVar8 + (uVar9 & 0xf) < puVar11) {
            puVar13 = puVar11;
          }
          lVar7 = uVar8 * 4 + uVar15;
          uVar12 = (long)puVar13 + (~(ulong)puVar1 - lVar7);
          auVar26._8_4_ = (int)uVar12;
          auVar26._0_8_ = uVar12;
          auVar26._12_4_ = (int)(uVar12 >> 0x20);
          auVar18._0_8_ = uVar12 >> 2;
          auVar18._8_8_ = auVar26._8_8_ >> 2;
          uVar12 = 0;
          auVar18 = auVar18 ^ _DAT_001f6c00;
          do {
            auVar23._8_4_ = (int)uVar12;
            auVar23._0_8_ = uVar12;
            auVar23._12_4_ = (int)(uVar12 >> 0x20);
            auVar26 = (auVar23 | auVar3) ^ auVar4;
            iVar22 = auVar18._4_4_;
            if ((bool)(~(auVar26._4_4_ == iVar22 && auVar18._0_4_ < auVar26._0_4_ ||
                        iVar22 < auVar26._4_4_) & 1)) {
              *(uint32_t *)((long)puVar1 + uVar12 * 4 + lVar7) = value;
            }
            if ((auVar26._12_4_ != auVar18._12_4_ || auVar26._8_4_ <= auVar18._8_4_) &&
                auVar26._12_4_ <= auVar18._12_4_) {
              *(uint32_t *)((long)puVar1 + uVar12 * 4 + lVar7 + 4) = value;
            }
            auVar26 = (auVar23 | auVar2) ^ auVar4;
            iVar27 = auVar26._4_4_;
            if (iVar27 <= iVar22 && (iVar27 != iVar22 || auVar26._0_4_ <= auVar18._0_4_)) {
              *(uint32_t *)((long)puVar1 + uVar12 * 4 + lVar7 + 8) = value;
              *(uint32_t *)((long)puVar1 + uVar12 * 4 + lVar7 + 0xc) = value;
            }
            uVar12 = uVar12 + 4;
          } while ((((long)puVar13 + ((uVar8 * -4 + ~(ulong)puVar1) - uVar15) >> 2) + 4 &
                   0xfffffffffffffffc) != uVar12);
          return;
        }
        uVar10 = (ulong)uVar17;
        auVar19._4_4_ = 0;
        auVar19._0_4_ = uVar17 ^ 0xf;
        auVar19._8_4_ = uVar17 ^ 0xf;
        auVar19._12_4_ = 0;
        uVar12 = 0;
        auVar19 = auVar19 | _DAT_001f6c00;
        do {
          auVar24._8_4_ = (int)uVar12;
          auVar24._0_8_ = uVar12;
          auVar24._12_4_ = (int)(uVar12 >> 0x20);
          auVar26 = (auVar24 | auVar3) ^ auVar4;
          iVar22 = auVar19._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar22 && auVar19._0_4_ < auVar26._0_4_ ||
                      iVar22 < auVar26._4_4_) & 1)) {
            puVar1[uVar8 + uVar10 + uVar12] = value;
          }
          if ((auVar26._12_4_ != auVar19._12_4_ || auVar26._8_4_ <= auVar19._8_4_) &&
              auVar26._12_4_ <= auVar19._12_4_) {
            puVar1[uVar8 + uVar10 + uVar12 + 1] = value;
          }
          auVar26 = (auVar24 | auVar2) ^ auVar4;
          iVar27 = auVar26._4_4_;
          if (iVar27 <= iVar22 && (iVar27 != iVar22 || auVar26._0_4_ <= auVar19._0_4_)) {
            puVar1[uVar8 + uVar10 + uVar12 + 2] = value;
            puVar1[uVar8 + uVar10 + uVar12 + 3] = value;
          }
          uVar12 = uVar12 + 4;
        } while ((0x13 - uVar17 & 0xfffffffc) != uVar12);
      }
      UVar16 = U_MEMORY_ALLOCATION_ERROR;
      if ((int)uVar15 < (int)(uVar9 & 0x3ffff0)) {
        puVar1 = this->index;
        puVar13 = this->data;
        do {
          uVar8 = uVar15 >> 4;
          if (this->flags[uVar8] == '\0') {
            puVar1[uVar8] = value;
          }
          else {
            uVar17 = puVar1[uVar8];
            lVar7 = 0;
            do {
              puVar11 = puVar13 + (ulong)uVar17 + lVar7;
              *puVar11 = value;
              puVar11[1] = value;
              puVar11[2] = value;
              puVar11[3] = value;
              lVar7 = lVar7 + 4;
            } while (lVar7 != 0x10);
          }
          uVar15 = uVar15 + 0x10;
        } while ((int)uVar15 < (int)(uVar9 & 0x3ffff0));
      }
      if ((uVar9 & 0xf) == 0) {
        return;
      }
      uVar17 = getDataBlock(this,(uint)(uVar15 >> 4) & 0xfffffff);
      auVar4 = _DAT_001f6c00;
      auVar3 = _DAT_001f6350;
      auVar2 = _DAT_001f6340;
      if (-1 < (int)uVar17) {
        puVar1 = this->data;
        uVar15 = (ulong)uVar17;
        puVar13 = puVar1 + uVar15 + 1;
        if (puVar1 + uVar15 + 1 < puVar1 + uVar15 + (uVar9 & 0xf)) {
          puVar13 = puVar1 + uVar15 + (uVar9 & 0xf);
        }
        uVar8 = (long)puVar13 + uVar15 * -4 + ~(ulong)puVar1;
        auVar20._8_4_ = (int)uVar8;
        auVar20._0_8_ = uVar8;
        auVar20._12_4_ = (int)(uVar8 >> 0x20);
        auVar21._0_8_ = uVar8 >> 2;
        auVar21._8_8_ = auVar20._8_8_ >> 2;
        uVar12 = 0;
        auVar21 = auVar21 ^ _DAT_001f6c00;
        do {
          auVar25._8_4_ = (int)uVar12;
          auVar25._0_8_ = uVar12;
          auVar25._12_4_ = (int)(uVar12 >> 0x20);
          auVar26 = (auVar25 | auVar3) ^ auVar4;
          iVar22 = auVar21._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar22 && auVar21._0_4_ < auVar26._0_4_ ||
                      iVar22 < auVar26._4_4_) & 1)) {
            puVar1[uVar15 + uVar12] = value;
          }
          if ((auVar26._12_4_ != auVar21._12_4_ || auVar26._8_4_ <= auVar21._8_4_) &&
              auVar26._12_4_ <= auVar21._12_4_) {
            puVar1[uVar15 + uVar12 + 1] = value;
          }
          auVar26 = (auVar25 | auVar2) ^ auVar4;
          iVar27 = auVar26._4_4_;
          if (iVar27 <= iVar22 && (iVar27 != iVar22 || auVar26._0_4_ <= auVar21._0_4_)) {
            puVar1[uVar15 + uVar12 + 2] = value;
            puVar1[uVar15 + uVar12 + 3] = value;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar8 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
        return;
      }
    }
  }
LAB_001c0152:
  *errorCode = UVar16;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }